

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_ec.cc
# Opt level: O1

int pkey_ec_derive(EVP_PKEY_CTX *ctx,uint8_t *key,size_t *keylen)

{
  EC_KEY *key_00;
  uint uVar1;
  int iVar2;
  EC_POINT *pub_key;
  EC_GROUP *group;
  
  if ((ctx->pkey == (EVP_PKEY *)0x0) || (ctx->peerkey == (EVP_PKEY *)0x0)) {
    iVar2 = 0;
    ERR_put_error(6,0,0x75,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_ec.cc"
                  ,100);
  }
  else {
    key_00 = (EC_KEY *)ctx->pkey->pkey;
    if (key == (uint8_t *)0x0) {
      group = EC_KEY_get0_group(key_00);
      iVar2 = EC_GROUP_get_degree(group);
      uVar1 = iVar2 + 7U >> 3;
    }
    else {
      pub_key = EC_KEY_get0_public_key((EC_KEY *)ctx->peerkey->pkey);
      uVar1 = ECDH_compute_key(key,*keylen,pub_key,key_00,(KDF *)0x0);
      if ((int)uVar1 < 0) {
        return 0;
      }
    }
    *keylen = (ulong)uVar1;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int pkey_ec_derive(EVP_PKEY_CTX *ctx, uint8_t *key, size_t *keylen) {
  if (!ctx->pkey || !ctx->peerkey) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_KEYS_NOT_SET);
    return 0;
  }

  const EC_KEY *eckey = reinterpret_cast<EC_KEY *>(ctx->pkey->pkey);
  if (!key) {
    const EC_GROUP *group;
    group = EC_KEY_get0_group(eckey);
    *keylen = (EC_GROUP_get_degree(group) + 7) / 8;
    return 1;
  }

  const EC_KEY *eckey_peer = reinterpret_cast<EC_KEY *>(ctx->peerkey->pkey);
  const EC_POINT *pubkey = EC_KEY_get0_public_key(eckey_peer);

  // NB: unlike PKCS#3 DH, if *outlen is less than maximum size this is
  // not an error, the result is truncated.
  size_t outlen = *keylen;
  int ret = ECDH_compute_key(key, outlen, pubkey, eckey, 0);
  if (ret < 0) {
    return 0;
  }
  *keylen = ret;
  return 1;
}